

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O3

int __thiscall
cppcms::applications_pool::mount
          (applications_pool *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,
          void *__data)

{
  size_t *psVar1;
  application_specific_pool *this_00;
  undefined8 *puVar2;
  _data *this_01;
  int extraout_EAX;
  _data *p_Var3;
  runtime_error *prVar4;
  _Node *p_Var5;
  unique_lock<std::recursive_mutex> lock;
  shared_ptr<cppcms::application_specific_pool> local_80;
  attachment local_70;
  unique_lock<std::recursive_mutex> local_38;
  
  if ((short)__fstype < 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_70.mp._0_8_ = (long)&local_70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Direct specification of cppcms::app::legacy flag is forbidden",
               "");
    booster::runtime_error::runtime_error(prVar4,(string *)&local_70);
    *(undefined ***)prVar4 = &PTR__runtime_error_00284840;
    (prVar4->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
    __cxa_throw(prVar4,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  this_00 = *(application_specific_pool **)__special_file;
  ((this_00->d).ptr_)->size = (long)((this->d).ptr_)->thread_count;
  application_specific_pool::flags(this_00,(int)__fstype);
  if (((ulong)__fstype & 0x20) != 0) {
    puVar2 = *(undefined8 **)(*(long *)(*(long *)__special_file + 0x18) + 0x10);
    (**(code **)*puVar2)(puVar2,this->srv_);
  }
  local_38._M_device = &((this->d).ptr_)->lock;
  local_38._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  local_38._M_owns = true;
  this_01 = (this->d).ptr_;
  p_Var3 = this_01;
  do {
    p_Var3 = (_data *)(p_Var3->apps).
                      super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
                      ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var3 == this_01) {
      local_80.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = *(element_type **)__special_file;
      local_80.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(__special_file + 8);
      if (local_80.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_80.
           super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_80.
                super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_80.
           super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_80.
                super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      _data::attachment::attachment(&local_70,&local_80,(mount_point *)__dir);
      p_Var5 = std::__cxx11::
               list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
               ::_M_create_node<cppcms::applications_pool::_data::attachment>
                         (&this_01->apps,&local_70);
      std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
      psVar1 = &(this_01->apps).
                super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (local_70.pool.
          super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.pool.
                   super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      mount_point::~mount_point(&local_70.mp);
      if (local_80.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.
                   super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
      return extraout_EAX;
    }
  } while ((p_Var3->lock).super___recursive_mutex_base._M_mutex.__align != *(long *)__special_file);
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_70.mp._0_8_ = (long)&local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"Attempt to mount application_specific_pool twice","");
  booster::runtime_error::runtime_error(prVar4,(string *)&local_70);
  *(undefined ***)prVar4 = &PTR__runtime_error_00284840;
  (prVar4->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
  __cxa_throw(prVar4,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void applications_pool::mount(booster::shared_ptr<application_specific_pool> gen,mount_point const &point,int flags)
{
	if(flags & app::legacy) {
		throw cppcms_error("Direct specification of cppcms::app::legacy flag is forbidden");
	}
	gen->size(d->thread_count);
	gen->flags(flags);
	if(flags & app::prepopulated)
		gen->prepopulate(*srv_);
	booster::unique_lock<booster::recursive_mutex> lock(d->lock);
	for(std::list<_data::attachment>::iterator it = d->apps.begin();it!=d->apps.end();++it) {
		if(it->pool == gen)
			throw cppcms_error("Attempt to mount application_specific_pool twice");
	}
	d->apps.push_back(_data::attachment(gen,point));
}